

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_split_multipleDelimiters_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x151e70;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,";01;;23;",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x151eb0;
  splitted = AString_split(&string,';',false);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar6 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
LAB_00152497:
    iVar1 = 0xa2a;
LAB_00152b2a:
    local_58 = (char *)0x8;
LAB_00152b30:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
    goto LAB_00152b32;
  }
  uStack_50 = 0x151ed1;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa2a);
  if (string.buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar8 = "(void*) (string).buffer";
    iVar1 = 0xa2a;
    goto LAB_00152a96;
  }
  uStack_50 = 0x151eee;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa2a);
  pcVar8 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar2 = "";
    pcVar8 = "(null)";
LAB_0015242b:
    local_60 = ";01;;23;";
    pcStack_70 = "(\";01;;23;\")";
    pcVar6 = "(string).buffer == (\";01;;23;\")";
    pcVar7 = "(string).buffer";
    iVar1 = 0xa2a;
  }
  else {
    uStack_50 = 0x151f0e;
    iVar1 = strcmp(";01;;23;",string.buffer);
    if (iVar1 != 0) {
      pcVar2 = "\"";
      goto LAB_0015242b;
    }
    uStack_50 = 0x151f27;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2a);
    if (string.size != 8) {
      local_60 = "strlen(\";01;;23;\")";
      pcVar6 = "(string).size == strlen(\";01;;23;\")";
      pcVar7 = "(string).size";
      pcVar2 = (char *)string.size;
      goto LAB_00152497;
    }
    uStack_50 = 0x151f47;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2a);
    if (splitted == (ASplittedString *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) splitted != NULL";
      pcVar8 = "(void*) splitted";
      iVar1 = 0xa2b;
      goto LAB_00152a96;
    }
    uStack_50 = 0x151f61;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2b);
    uStack_50 = 0x151f69;
    pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
    if (pcVar2 != (char *)0x5) {
      local_60 = "5";
      pcVar6 = "private_ACUtils_ADynArray_size(splitted) == 5";
      pcVar7 = "private_ACUtils_ADynArray_size(splitted)";
      iVar1 = 0xa2c;
      local_58 = (char *)0x5;
      goto LAB_00152b30;
    }
    uStack_50 = 0x151f84;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2c);
    pcVar2 = (char *)(*splitted->buffer)->capacity;
    if (pcVar2 != (char *)0x8) {
      local_60 = "(8)";
      pcVar6 = "(*(splitted->buffer[0])).capacity == (8)";
      pcVar7 = "(*(splitted->buffer[0])).capacity";
      iVar1 = 0xa2d;
      goto LAB_00152b2a;
    }
    uStack_50 = 0x151faa;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2d);
    if ((*splitted->buffer)->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
      pcVar8 = "(void*) (*(splitted->buffer[0])).buffer";
LAB_0015260a:
      iVar1 = 0xa2d;
LAB_00152a96:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(undefined8 *)((long)ppcVar4 + -8) = 0x152a9d;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,pcVar6,pcVar2,pcVar7,pcVar8);
    }
    uStack_50 = 0x151fcd;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2d);
    pcVar2 = (*splitted->buffer)->buffer;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "(null)";
      pcStack_78 = "";
LAB_00152590:
      pcVar7 = "(*(splitted->buffer[0])).buffer == (\"\")";
      pcVar6 = "(void*) (*(splitted->buffer[0])).buffer";
      iVar1 = 0xa2d;
LAB_001527bd:
      uStack_50 = 0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      pcStack_70 = "(\"\")";
      pcStack_80 = pcVar2;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",pcVar7,pcVar6 + 8,
                        pcStack_78);
    }
    if (*pcVar2 != '\0') {
      pcStack_78 = "\"";
      goto LAB_00152590;
    }
    uStack_50 = 0x152003;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2d);
    pcVar3 = (char *)(*splitted->buffer)->size;
    if (pcVar3 != (char *)0x0) {
      ppcVar4 = &local_68;
      local_60 = "strlen(\"\")";
      pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar7 = "(*(splitted->buffer[0])).size == strlen(\"\")";
      pcVar8 = "(*(splitted->buffer[0])).size";
      local_68 = pcVar3;
      goto LAB_0015260a;
    }
    uStack_50 = 0x152028;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2d);
    pcVar2 = (char *)splitted->buffer[1]->capacity;
    if (pcVar2 != (char *)0x8) {
      local_60 = "(8)";
      pcVar6 = "(*(splitted->buffer[1])).capacity == (8)";
      pcVar7 = "(*(splitted->buffer[1])).capacity";
      iVar1 = 0xa2e;
      goto LAB_00152b2a;
    }
    uStack_50 = 0x15204f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2e);
    if (splitted->buffer[1]->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (*(splitted->buffer[1])).buffer != NULL";
      pcVar8 = "(void*) (*(splitted->buffer[1])).buffer";
      iVar1 = 0xa2e;
      goto LAB_00152a96;
    }
    uStack_50 = 0x152073;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2e);
    pcVar8 = splitted->buffer[1]->buffer;
    if (pcVar8 == (char *)0x0) {
      pcVar2 = "";
      pcVar8 = "(null)";
LAB_00152697:
      local_60 = "01";
      pcStack_70 = "(\"01\")";
      pcVar6 = "(*(splitted->buffer[1])).buffer == (\"01\")";
      pcVar7 = "(*(splitted->buffer[1])).buffer";
      iVar1 = 0xa2e;
    }
    else {
      uStack_50 = 0x152097;
      iVar1 = strcmp("01",pcVar8);
      if (iVar1 != 0) {
        pcVar2 = "\"";
        goto LAB_00152697;
      }
      uStack_50 = 0x1520b0;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2e);
      pcVar2 = (char *)splitted->buffer[1]->size;
      if (pcVar2 != (char *)0x2) {
        local_60 = "(*(splitted->buffer[0])).size == strlen(\"01\")";
        pcVar6 = "(*(splitted->buffer[1])).size == strlen(\"01\")";
        pcVar7 = "(*(splitted->buffer[1])).size";
        iVar1 = 0xa2e;
LAB_0015291e:
        local_60 = local_60 + 0x21;
        local_58 = (char *)0x2;
        goto LAB_00152b30;
      }
      uStack_50 = 0x1520d7;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2e);
      pcVar2 = (char *)splitted->buffer[2]->capacity;
      if (pcVar2 != (char *)0x8) {
        local_60 = "(8)";
        pcVar6 = "(*(splitted->buffer[2])).capacity == (8)";
        pcVar7 = "(*(splitted->buffer[2])).capacity";
        iVar1 = 0xa2f;
        goto LAB_00152b2a;
      }
      uStack_50 = 0x1520fe;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2f);
      if (splitted->buffer[2]->buffer == (char *)0x0) {
        ppcVar4 = &local_58;
        pcVar6 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) (*(splitted->buffer[2])).buffer != NULL";
        pcVar8 = "(void*) (*(splitted->buffer[2])).buffer";
LAB_00152811:
        iVar1 = 0xa2f;
        goto LAB_00152a96;
      }
      uStack_50 = 0x152122;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2f);
      pcVar2 = splitted->buffer[2]->buffer;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "(null)";
        pcStack_78 = "";
LAB_00152787:
        pcVar7 = "(*(splitted->buffer[2])).buffer == (\"\")";
        pcVar6 = "(void*) (*(splitted->buffer[2])).buffer";
        iVar1 = 0xa2f;
        goto LAB_001527bd;
      }
      if (*pcVar2 != '\0') {
        pcStack_78 = "\"";
        goto LAB_00152787;
      }
      uStack_50 = 0x152159;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2f);
      pcVar3 = (char *)splitted->buffer[2]->size;
      if (pcVar3 != (char *)0x0) {
        ppcVar4 = &local_68;
        local_60 = "strlen(\"\")";
        pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar7 = "(*(splitted->buffer[2])).size == strlen(\"\")";
        pcVar8 = "(*(splitted->buffer[2])).size";
        local_68 = pcVar3;
        goto LAB_00152811;
      }
      uStack_50 = 0x15217f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2f);
      pcVar2 = (char *)splitted->buffer[3]->capacity;
      if (pcVar2 != (char *)0x8) {
        local_60 = "(8)";
        pcVar6 = "(*(splitted->buffer[3])).capacity == (8)";
        pcVar7 = "(*(splitted->buffer[3])).capacity";
        iVar1 = 0xa30;
        goto LAB_00152b2a;
      }
      uStack_50 = 0x1521a6;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa30);
      if (splitted->buffer[3]->buffer == (char *)0x0) {
        ppcVar4 = &local_58;
        pcVar6 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) (*(splitted->buffer[3])).buffer != NULL";
        pcVar8 = "(void*) (*(splitted->buffer[3])).buffer";
        iVar1 = 0xa30;
        goto LAB_00152a96;
      }
      uStack_50 = 0x1521ca;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa30);
      pcVar8 = splitted->buffer[3]->buffer;
      if (pcVar8 == (char *)0x0) {
        pcVar2 = "";
        pcVar8 = "(null)";
      }
      else {
        uStack_50 = 0x1521ee;
        iVar1 = strcmp("23",pcVar8);
        if (iVar1 == 0) {
          uStack_50 = 0x152207;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa30);
          pcVar2 = (char *)splitted->buffer[3]->size;
          if (pcVar2 != (char *)0x2) {
            local_60 = "(*(splitted->buffer[1])).size == strlen(\"23\")";
            pcVar6 = "(*(splitted->buffer[3])).size == strlen(\"23\")";
            pcVar7 = "(*(splitted->buffer[3])).size";
            iVar1 = 0xa30;
            goto LAB_0015291e;
          }
          uStack_50 = 0x15222e;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa30);
          pcVar2 = (char *)splitted->buffer[4]->capacity;
          if (pcVar2 != (char *)0x8) {
            local_60 = "(8)";
            pcVar6 = "(*(splitted->buffer[4])).capacity == (8)";
            pcVar7 = "(*(splitted->buffer[4])).capacity";
            iVar1 = 0xa31;
            goto LAB_00152b2a;
          }
          uStack_50 = 0x152255;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa31);
          if (splitted->buffer[4]->buffer == (char *)0x0) {
            ppcVar4 = &local_58;
            pcVar6 = "Assertion \'_ck_x != NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar7 = "(void*) (*(splitted->buffer[4])).buffer != NULL";
            pcVar8 = "(void*) (*(splitted->buffer[4])).buffer";
          }
          else {
            uStack_50 = 0x152279;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa31);
            pcVar2 = splitted->buffer[4]->buffer;
            if (pcVar2 == (char *)0x0) {
              pcVar2 = "(null)";
              pcStack_78 = "";
LAB_001529a3:
              uStack_50 = 0;
              local_58 = "\"";
              local_60 = "";
              local_68 = "\"";
              pcStack_70 = "(\"\")";
              pcStack_80 = pcVar2;
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa31,
                                "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                "(*(splitted->buffer[4])).buffer == (\"\")",
                                "(*(splitted->buffer[4])).buffer",pcStack_78);
            }
            if (*pcVar2 != '\0') {
              pcStack_78 = "\"";
              goto LAB_001529a3;
            }
            uStack_50 = 0x1522b0;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa31);
            pcVar3 = (char *)splitted->buffer[4]->size;
            if (pcVar3 == (char *)0x0) {
              uStack_50 = 0x1522d6;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa31);
              uStack_50 = 0x1522de;
              AString_freeSplitted(splitted);
              if (string.capacity == 8) {
                uStack_50 = 0x1522fe;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa33);
                if (string.buffer == (char *)0x0) {
                  ppcVar4 = &local_58;
                  pcVar6 = "Assertion \'_ck_x != NULL\' failed";
                  pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                  pcVar7 = "(void*) (string).buffer != NULL";
                  pcVar8 = "(void*) (string).buffer";
                  iVar1 = 0xa33;
                  goto LAB_00152a96;
                }
                uStack_50 = 0x15231b;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa33);
                pcVar8 = string.buffer;
                if (string.buffer == (char *)0x0) {
                  pcVar8 = "(null)";
                  pcVar2 = "";
                }
                else {
                  uStack_50 = 0x152338;
                  iVar1 = strcmp(";01;;23;",string.buffer);
                  if (iVar1 == 0) {
                    uStack_50 = 0x152351;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa33);
                    if (string.size == 8) {
                      uStack_50 = 0x152371;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa33);
                      local_58 = (char *)private_ACUtilsTest_AString_freeCount;
                      if (private_ACUtilsTest_AString_reallocCount ==
                          private_ACUtilsTest_AString_freeCount) {
                        uStack_50 = 0x152399;
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa34);
                        uStack_50 = 0x1523a2;
                        (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))
                                  (string.buffer);
                        return;
                      }
                      expr = "Assertion \'_ck_x == _ck_y\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                      pcVar6 = 
                      "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                      ;
                      pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                      iVar1 = 0xa34;
                      ppcVar5 = &local_60;
                      local_60 = "(private_ACUtilsTest_AString_freeCount)";
                      pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
                      goto LAB_00152b32;
                    }
                    local_60 = "strlen(\";01;;23;\")";
                    pcVar6 = "(string).size == strlen(\";01;;23;\")";
                    pcVar7 = "(string).size";
                    pcVar2 = (char *)string.size;
                    goto LAB_00152b25;
                  }
                  pcVar2 = "\"";
                }
                expr = 
                "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                ;
                pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                pcVar6 = "(string).buffer == (\";01;;23;\")";
                pcVar7 = "(string).buffer";
                iVar1 = 0xa33;
                local_58 = "\"";
                local_60 = ";01;;23;";
                local_68 = "\"";
                pcStack_70 = "(\";01;;23;\")";
                ppcVar5 = &pcStack_80;
                pcStack_80 = pcVar8;
                pcStack_78 = pcVar2;
                goto LAB_00152b32;
              }
              local_60 = "(8)";
              pcVar6 = "(string).capacity == (8)";
              pcVar7 = "(string).capacity";
              pcVar2 = (char *)string.capacity;
LAB_00152b25:
              iVar1 = 0xa33;
              goto LAB_00152b2a;
            }
            ppcVar4 = &local_68;
            local_60 = "strlen(\"\")";
            pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar7 = "(*(splitted->buffer[4])).size == strlen(\"\")";
            pcVar8 = "(*(splitted->buffer[4])).size";
            local_68 = pcVar3;
          }
          iVar1 = 0xa31;
          goto LAB_00152a96;
        }
        pcVar2 = "\"";
      }
      local_60 = "23";
      pcStack_70 = "(\"23\")";
      pcVar6 = "(*(splitted->buffer[3])).buffer == (\"23\")";
      pcVar7 = "(*(splitted->buffer[3])).buffer";
      iVar1 = 0xa30;
    }
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar8;
  pcStack_78 = pcVar2;
LAB_00152b32:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar2;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x152b39;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_split_multipleDelimiters)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";01;;23;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 5);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "01", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 2), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 3), "23", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 4), "", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}